

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseBase.h
# Opt level: O2

void __thiscall
Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
swap<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,0>>
          (DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *this,
          DenseBase<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>_>
          *other)

{
  swap_assign_op<double> local_1;
  
  if ((*(long *)(this + 8) == *(long *)(other + 8)) &&
     (*(long *)(this + 0x10) == *(long *)(other + 0x10))) {
    internal::
    call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,0>,Eigen::internal::swap_assign_op<double>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)this,
               (Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0> *)
               other,&local_1);
    return;
  }
  __assert_fail("rows()==other.rows() && cols()==other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/DenseBase.h"
                ,0x1a1,
                "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::swap(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, OtherDerived = Eigen::Reverse<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 0>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
    void swap(const DenseBase<OtherDerived>& other)
    {
      EIGEN_STATIC_ASSERT(!OtherDerived::IsPlainObjectBase,THIS_EXPRESSION_IS_NOT_A_LVALUE__IT_IS_READ_ONLY);
      eigen_assert(rows()==other.rows() && cols()==other.cols());
      call_assignment(derived(), other.const_cast_derived(), internal::swap_assign_op<Scalar>());
    }